

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

void scalar_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  int iVar1;
  t_template *x_00;
  t_symbol *ptVar2;
  t_symbol *ptVar3;
  t_float tVar4;
  t_float tVar5;
  int local_a8;
  int local_a4;
  int goty;
  int gotx;
  int ytype;
  int xtype;
  int yonset;
  int xonset;
  t_gpointer gp;
  t_atom at [3];
  t_symbol *local_40;
  t_symbol *zz;
  t_template *template;
  t_symbol *templatesym;
  t_scalar *x;
  int dy_local;
  int dx_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  template = (t_template *)z[1].g_pd;
  templatesym = (t_symbol *)z;
  x._0_4_ = dy;
  x._4_4_ = dx;
  _dy_local = glist;
  glist_local = (_glist *)z;
  x_00 = template_findbyname((t_symbol *)template);
  zz = (t_symbol *)x_00;
  if (x_00 == (t_template *)0x0) {
    pd_error((void *)0x0,"scalar: couldn\'t find template %s",template->t_pdobj);
  }
  else {
    ptVar2 = gensym("x");
    local_a4 = template_find_field(x_00,ptVar2,&xtype,&gotx,&local_40);
    ptVar2 = zz;
    if ((local_a4 != 0) && (gotx != 0)) {
      local_a4 = 0;
    }
    ptVar3 = gensym("y");
    local_a8 = template_find_field((t_template *)ptVar2,ptVar3,&ytype,&goty,&local_40);
    if ((local_a8 != 0) && (goty != 0)) {
      local_a8 = 0;
    }
    if (local_a4 != 0) {
      iVar1 = _dy_local->gl_zoom * x._4_4_;
      tVar4 = glist_pixelstox(_dy_local,1.0);
      tVar5 = glist_pixelstox(_dy_local,0.0);
      *(float *)((long)&templatesym[1].s_name + (long)xtype) =
           (float)iVar1 * (tVar4 - tVar5) + *(float *)((long)&templatesym[1].s_name + (long)xtype);
    }
    if (local_a8 != 0) {
      iVar1 = _dy_local->gl_zoom * (int)x;
      tVar4 = glist_pixelstoy(_dy_local,1.0);
      tVar5 = glist_pixelstoy(_dy_local,0.0);
      *(float *)((long)&templatesym[1].s_name + (long)ytype) =
           (float)iVar1 * (tVar4 - tVar5) + *(float *)((long)&templatesym[1].s_name + (long)ytype);
    }
    gpointer_init((t_gpointer *)&yonset);
    gpointer_setglist((t_gpointer *)&yonset,_dy_local,(t_scalar *)templatesym);
    ptVar2 = zz;
    gp.gp_stub._0_4_ = 3;
    ptVar3 = gensym("displace");
    template_notify((t_template *)ptVar2,ptVar3,2,(t_atom *)&gp.gp_stub);
    scalar_redraw((t_scalar *)templatesym,_dy_local);
  }
  return;
}

Assistant:

static void scalar_displace(t_gobj *z, t_glist *glist, int dx, int dy)
{
    t_scalar *x = (t_scalar *)z;
    t_symbol *templatesym = x->sc_template;
    t_template *template = template_findbyname(templatesym);
    t_symbol *zz;
    t_atom at[3];
    t_gpointer gp;
    int xonset, yonset, xtype, ytype, gotx, goty;
    if (!template)
    {
        pd_error(0, "scalar: couldn't find template %s", templatesym->s_name);
        return;
    }
    gotx = template_find_field(template, gensym("x"), &xonset, &xtype, &zz);
    if (gotx && (xtype != DT_FLOAT))
        gotx = 0;
    goty = template_find_field(template, gensym("y"), &yonset, &ytype, &zz);
    if (goty && (ytype != DT_FLOAT))
        goty = 0;
    if (gotx)
        *(t_float *)(((char *)(x->sc_vec)) + xonset) +=
            glist->gl_zoom * dx * (glist_pixelstox(glist, 1) - glist_pixelstox(glist, 0));
    if (goty)
        *(t_float *)(((char *)(x->sc_vec)) + yonset) +=
            glist->gl_zoom * dy * (glist_pixelstoy(glist, 1) - glist_pixelstoy(glist, 0));
    gpointer_init(&gp);
    gpointer_setglist(&gp, glist, x);
    SETPOINTER(&at[0], &gp);
    SETFLOAT(&at[1], (t_float)dx);
    SETFLOAT(&at[2], (t_float)dy);
    template_notify(template, gensym("displace"), 2, at);
    scalar_redraw(x, glist);
}